

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O0

bool bssl::hkdf_expand_label
               (Span<unsigned_char> out,EVP_MD *digest,Span<const_unsigned_char> secret,
               string_view label,Span<const_unsigned_char> hash,bool is_dtls)

{
  string_view label_prefix;
  Span<const_unsigned_char> secret_00;
  Span<unsigned_char> out_00;
  EVP_MD *digest_00;
  int iVar1;
  uchar *out_01;
  size_t out_len;
  uchar *secret_01;
  size_t secret_len;
  uint8_t *label_00;
  size_type label_len;
  uchar *hash_00;
  size_t hash_len;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  EVP_MD *local_60;
  uchar *local_58;
  uchar *local_50;
  size_t local_48;
  undefined1 local_39;
  EVP_MD *pEStack_38;
  bool is_dtls_local;
  EVP_MD *digest_local;
  Span<const_unsigned_char> secret_local;
  Span<unsigned_char> out_local;
  
  local_48 = out.size_;
  local_50 = out.data_;
  local_58 = (uchar *)secret.size_;
  local_60 = (EVP_MD *)secret.data_;
  local_39 = is_dtls;
  pEStack_38 = digest;
  digest_local = local_60;
  secret_local.data_ = local_58;
  secret_local.size_ = (size_t)local_50;
  if (is_dtls) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"dtls13");
    out_00.size_ = local_48;
    out_00.data_ = local_50;
    secret_00.size_ = (size_t)local_58;
    secret_00.data_ = (uchar *)local_60;
    label_prefix._M_str = local_70._M_str;
    label_prefix._M_len = local_70._M_len;
    out_local.size_._7_1_ =
         hkdf_expand_label_with_prefix(out_00,digest,secret_00,label_prefix,label,hash);
  }
  else {
    out_01 = Span<unsigned_char>::data((Span<unsigned_char> *)&secret_local.size_);
    out_len = Span<unsigned_char>::size((Span<unsigned_char> *)&secret_local.size_);
    digest_00 = pEStack_38;
    secret_01 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&digest_local);
    secret_len = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&digest_local);
    label_00 = (uint8_t *)std::basic_string_view<char,_std::char_traits<char>_>::data(&label);
    label_len = std::basic_string_view<char,_std::char_traits<char>_>::size(&label);
    hash_00 = Span<const_unsigned_char>::data(&hash);
    hash_len = Span<const_unsigned_char>::size(&hash);
    iVar1 = CRYPTO_tls13_hkdf_expand_label
                      (out_01,out_len,digest_00,secret_01,secret_len,label_00,label_len,hash_00,
                       hash_len);
    out_local.size_._7_1_ = iVar1 == 1;
  }
  return out_local.size_._7_1_;
}

Assistant:

static bool hkdf_expand_label(Span<uint8_t> out, const EVP_MD *digest,
                              Span<const uint8_t> secret,
                              std::string_view label, Span<const uint8_t> hash,
                              bool is_dtls) {
  if (is_dtls) {
    return hkdf_expand_label_with_prefix(out, digest, secret, "dtls13", label,
                                         hash);
  }
  return CRYPTO_tls13_hkdf_expand_label(
             out.data(), out.size(), digest, secret.data(), secret.size(),
             reinterpret_cast<const uint8_t *>(label.data()), label.size(),
             hash.data(), hash.size()) == 1;
}